

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FRandom * ParseRNG(FScanner *sc)

{
  bool bVar1;
  FRandom *pFVar2;
  
  bVar1 = FScanner::CheckToken(sc,0x5b);
  if (bVar1) {
    FScanner::MustGetToken(sc,0x101);
    pFVar2 = FRandom::StaticFindRNG(sc->String);
    FScanner::MustGetToken(sc,0x5d);
  }
  else {
    pFVar2 = &pr_exrandom;
  }
  return pFVar2;
}

Assistant:

static FRandom *ParseRNG(FScanner &sc)
{
	FRandom *rng;

	if (sc.CheckToken('['))
	{
		sc.MustGetToken(TK_Identifier);
		rng = FRandom::StaticFindRNG(sc.String);
		sc.MustGetToken(']');
	}
	else
	{
		rng = &pr_exrandom;
	}
	return rng;
}